

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

void __thiscall soplex::SPxDevexPR<double>::addedVecs(SPxDevexPR<double> *this,int n)

{
  Type TVar1;
  SPxSolverBase<double> *pSVar2;
  pointer pdVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  pointer pdVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  TVar1 = pSVar2->theType;
  pdVar3 = (pSVar2->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (pSVar2->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  VectorBase<double>::reDim(&pSVar2->weights,(pSVar2->thevectors->set).thenum,true);
  auVar6 = _DAT_00601040;
  auVar5 = _DAT_00601030;
  pdVar8 = (pSVar2->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = (int)((ulong)((long)(pSVar2->weights).val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar8) >> 3);
  iVar11 = (int)((ulong)((long)pdVar3 - (long)pdVar4) >> 3);
  if (iVar11 < iVar7) {
    dVar14 = (double)(byte)((TVar1 == ENTER) + 1);
    lVar9 = (long)iVar7;
    lVar12 = lVar9 + -1;
    if ((long)iVar11 < lVar9 + -1) {
      lVar12 = (long)iVar11;
    }
    lVar13 = (lVar9 - lVar12) + -1;
    auVar15._8_4_ = (int)lVar13;
    auVar15._0_8_ = lVar13;
    auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
    pdVar8 = pdVar8 + lVar9 + -1;
    uVar10 = 0;
    auVar15 = auVar15 ^ _DAT_00601040;
    do {
      auVar16._8_4_ = (int)uVar10;
      auVar16._0_8_ = uVar10;
      auVar16._12_4_ = (int)(uVar10 >> 0x20);
      auVar16 = (auVar16 | auVar5) ^ auVar6;
      if ((bool)(~(auVar16._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar16._0_4_ ||
                  auVar15._4_4_ < auVar16._4_4_) & 1)) {
        *pdVar8 = dVar14;
      }
      if ((auVar16._12_4_ != auVar15._12_4_ || auVar16._8_4_ <= auVar15._8_4_) &&
          auVar16._12_4_ <= auVar15._12_4_) {
        pdVar8[-1] = dVar14;
      }
      uVar10 = uVar10 + 2;
      pdVar8 = pdVar8 + -2;
    } while (((lVar9 - lVar12) + 1U & 0xfffffffffffffffe) != uVar10);
  }
  return;
}

Assistant:

void SPxDevexPR<R>::addedVecs(int n)
{
   int initval = (this->thesolver->type() == SPxSolverBase<R>::ENTER) ? 2 : 1;
   VectorBase<R>& weights = this->thesolver->weights;
   n = weights.dim();
   weights.reDim(this->thesolver->coDim());

   for(int i = weights.dim() - 1; i >= n; --i)
      weights[i] = initval;
}